

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InternalException::InternalException<duckdb::LogicalType>
          (InternalException *this,string *msg,LogicalType *params)

{
  LogicalType local_50;
  string local_38;
  
  LogicalType::LogicalType(&local_50,params);
  Exception::ConstructMessage<duckdb::LogicalType>(&local_38,msg,&local_50);
  InternalException(this,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  LogicalType::~LogicalType(&local_50);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}